

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

void deqp::ub::anon_unknown_1::generateDeclaration
               (ostringstream *src,VarType *type,char *name,int indentLevel,deUint32 unusedHints)

{
  VarType *pVVar1;
  bool bVar2;
  deUint32 dVar3;
  DataType DVar4;
  ostream *poVar5;
  char *pcVar6;
  reference piVar7;
  StructType *pSVar8;
  char *local_128;
  char *local_120;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_90;
  undefined1 local_88 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_78;
  const_reverse_iterator sizeIter;
  int local_5c;
  VarType *local_58;
  VarType *curType;
  vector<int,_std::allocator<int>_> arraySizes;
  LayoutFlagsFmt local_30;
  uint local_2c;
  deUint32 local_28;
  deUint32 flags;
  deUint32 unusedHints_local;
  int indentLevel_local;
  char *name_local;
  VarType *type_local;
  ostringstream *src_local;
  
  local_28 = unusedHints;
  flags = indentLevel;
  _unusedHints_local = name;
  name_local = (char *)type;
  type_local = (VarType *)src;
  local_2c = ub::VarType::getFlags(type);
  if ((local_2c & 0xf8) != 0) {
    poVar5 = std::operator<<((ostream *)type_local,"layout(");
    LayoutFlagsFmt::LayoutFlagsFmt(&local_30,local_2c & 0xf8);
    poVar5 = ub::operator<<(poVar5,&local_30);
    std::operator<<(poVar5,") ");
  }
  pVVar1 = type_local;
  if ((local_2c & 7) != 0) {
    PrecisionFlagsFmt::PrecisionFlagsFmt
              ((PrecisionFlagsFmt *)
               ((long)&arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),local_2c & 7);
    poVar5 = ub::operator<<((ostream *)pVVar1,
                            (PrecisionFlagsFmt *)
                            ((long)&arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage + 4));
    std::operator<<(poVar5," ");
  }
  bVar2 = ub::VarType::isBasicType((VarType *)name_local);
  pVVar1 = type_local;
  if (bVar2) {
    DVar4 = ub::VarType::getBasicType((VarType *)name_local);
    pcVar6 = glu::getDataTypeName(DVar4);
    poVar5 = std::operator<<((ostream *)pVVar1,pcVar6);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,_unusedHints_local);
  }
  else {
    bVar2 = ub::VarType::isArrayType((VarType *)name_local);
    pVVar1 = type_local;
    if (bVar2) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&curType);
      local_58 = (VarType *)name_local;
      while (bVar2 = ub::VarType::isArrayType(local_58), bVar2) {
        local_5c = ub::VarType::getArraySize(local_58);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&curType,&local_5c);
        local_58 = ub::VarType::getElementType(local_58);
      }
      bVar2 = ub::VarType::isBasicType(local_58);
      pVVar1 = type_local;
      if (bVar2) {
        dVar3 = ub::VarType::getFlags(local_58);
        pVVar1 = type_local;
        if ((dVar3 & 7) != 0) {
          dVar3 = ub::VarType::getFlags(local_58);
          PrecisionFlagsFmt::PrecisionFlagsFmt((PrecisionFlagsFmt *)&sizeIter,dVar3 & 7);
          poVar5 = ub::operator<<((ostream *)pVVar1,(PrecisionFlagsFmt *)&sizeIter);
          std::operator<<(poVar5," ");
        }
        pVVar1 = type_local;
        DVar4 = ub::VarType::getBasicType(local_58);
        pcVar6 = glu::getDataTypeName(DVar4);
        std::operator<<((ostream *)pVVar1,pcVar6);
      }
      else {
        pSVar8 = ub::VarType::getStruct(local_58);
        generateLocalDeclaration((ostringstream *)pVVar1,pSVar8,flags + 1);
      }
      poVar5 = std::operator<<((ostream *)type_local," ");
      std::operator<<(poVar5,_unusedHints_local);
      std::vector<int,_std::allocator<int>_>::rbegin
                ((vector<int,_std::allocator<int>_> *)(local_88 + 8));
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
      ::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  *)&local_78,
                 (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                  *)(local_88 + 8));
      while( true ) {
        std::vector<int,_std::allocator<int>_>::rend((vector<int,_std::allocator<int>_> *)local_88);
        bVar2 = std::operator!=(&local_78,
                                (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                 *)local_88);
        if (!bVar2) break;
        poVar5 = std::operator<<((ostream *)type_local,"[");
        piVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 ::operator*(&local_78);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar7);
        std::operator<<(poVar5,"]");
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
        ::operator++(&local_90,(int)&local_78);
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&curType)
      ;
    }
    else {
      pSVar8 = ub::VarType::getStruct((VarType *)name_local);
      generateLocalDeclaration((ostringstream *)pVVar1,pSVar8,flags + 1);
      poVar5 = std::operator<<((ostream *)type_local," ");
      std::operator<<(poVar5,_unusedHints_local);
    }
  }
  std::operator<<((ostream *)type_local,";");
  if (local_28 != 0) {
    poVar5 = std::operator<<((ostream *)type_local," // unused in ");
    if (local_28 == 0xc00) {
      local_120 = "both shaders";
    }
    else {
      if (local_28 == 0x400) {
        local_128 = "vertex shader";
      }
      else {
        local_128 = "???";
        if (local_28 == 0x800) {
          local_128 = "fragment shader";
        }
      }
      local_120 = local_128;
    }
    std::operator<<(poVar5,local_120);
  }
  std::operator<<((ostream *)type_local,"\n");
  return;
}

Assistant:

void generateDeclaration(std::ostringstream& src, const VarType& type, const char* name, int indentLevel,
						 deUint32 unusedHints)
{
	deUint32 flags = type.getFlags();

	if ((flags & LAYOUT_MASK) != 0)
		src << "layout(" << LayoutFlagsFmt(flags & LAYOUT_MASK) << ") ";

	if ((flags & PRECISION_MASK) != 0)
		src << PrecisionFlagsFmt(flags & PRECISION_MASK) << " ";

	if (type.isBasicType())
		src << glu::getDataTypeName(type.getBasicType()) << " " << name;
	else if (type.isArrayType())
	{
		std::vector<int> arraySizes;
		const VarType*   curType = &type;
		while (curType->isArrayType())
		{
			arraySizes.push_back(curType->getArraySize());
			curType = &curType->getElementType();
		}

		if (curType->isBasicType())
		{
			if ((curType->getFlags() & PRECISION_MASK) != 0)
				src << PrecisionFlagsFmt(curType->getFlags() & PRECISION_MASK) << " ";
			src << glu::getDataTypeName(curType->getBasicType());
		}
		else
		{
			DE_ASSERT(curType->isStructType());
			generateLocalDeclaration(src, curType->getStruct(), indentLevel + 1);
		}

		src << " " << name;

		for (std::vector<int>::const_reverse_iterator sizeIter = arraySizes.rbegin(); sizeIter != arraySizes.rend();
			 sizeIter++)
			src << "[" << *sizeIter << "]";
	}
	else
	{
		generateLocalDeclaration(src, type.getStruct(), indentLevel + 1);
		src << " " << name;
	}

	src << ";";

	// Print out unused hints.
	if (unusedHints != 0)
		src << " // unused in "
			<< (unusedHints == UNUSED_BOTH ?
					"both shaders" :
					unusedHints == UNUSED_VERTEX ? "vertex shader" :
												   unusedHints == UNUSED_FRAGMENT ? "fragment shader" : "???");

	src << "\n";
}